

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InternalString.cpp
# Opt level: O0

InternalString * Js::InternalString::New(ArenaAllocator *alloc,char16 *content,charcount_t length)

{
  char16 *this;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc_00;
  InternalString *this_00;
  TrackAllocData local_78;
  InternalString *newInstance;
  char16 *buffer;
  DWORD *allocbuffer;
  size_t bytelength;
  char16 *pcStack_28;
  charcount_t length_local;
  char16 *content_local;
  ArenaAllocator *alloc_local;
  ArenaAllocator *local_10;
  
  allocbuffer = (DWORD *)((ulong)length * 2);
  alloc_local = (ArenaAllocator *)((long)allocbuffer + 6);
  bytelength._4_4_ = length;
  pcStack_28 = content;
  content_local = (char16 *)alloc;
  local_10 = alloc;
  buffer = (char16 *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                     (&alloc->
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                      (size_t)alloc_local);
  *(undefined4 *)buffer = allocbuffer._0_4_;
  newInstance = (InternalString *)(buffer + 2);
  js_memcpy_s(newInstance,(size_t)allocbuffer,pcStack_28,(size_t)allocbuffer);
  this = content_local;
  *(undefined2 *)((long)&newInstance->m_charLength + (ulong)bytelength._4_4_ * 2) = 0;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/InternalString.cpp"
             ,0x25);
  alloc_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_78);
  this_00 = (InternalString *)new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)alloc_00,0x3f67b0);
  InternalString(this_00,(char16 *)newInstance,bytelength._4_4_,'\0');
  return this_00;
}

Assistant:

InternalString *InternalString::New(ArenaAllocator* alloc, const char16* content, charcount_t length)
    {
        size_t bytelength = sizeof(char16) * length;
        DWORD* allocbuffer = (DWORD*)alloc->Alloc(sizeof(DWORD) + bytelength + sizeof(char16));
        allocbuffer[0] = (DWORD) bytelength;

        char16* buffer = (char16*)(allocbuffer+1);
        js_memcpy_s(buffer, bytelength, content, bytelength);
        buffer[length] = _u('\0');
        InternalString* newInstance = Anew(alloc, InternalString, buffer, length);
        return newInstance;
    }